

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
               *this,int i)

{
  return -(((this->left_->fadexpr_).right_)->dx_).ptr_to_data[i] -
         (((this->right_->fadexpr_).right_)->dx_).ptr_to_data[i] *
         (this->right_->fadexpr_).left_.constant_;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) - right_.fastAccessDx(i);}